

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verify<int,int>(int *contents,Options *options)

{
  uchar *in_RCX;
  size_t siglen;
  uchar *in_RSI;
  size_t in_R8;
  int *in_stack_00000158;
  EVP_PKEY_CTX local_30 [32];
  uchar *local_10;
  
  local_10 = in_RSI;
  StringMaker::toString<int>(in_stack_00000158);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
            (local_30,local_10,siglen,in_RCX,in_R8);
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void verify(const T& contents, const Options& options = Options())
        {
            verify(TCompileTimeOptions::ToStringConverter::toString(contents), options);
        }